

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O2

void __thiscall
test_adjacency_graph_shrink_to_fit_Test::test_adjacency_graph_shrink_to_fit_Test
          (test_adjacency_graph_shrink_to_fit_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00168f38;
  return;
}

Assistant:

TEST(test_adjacency_graph, shrink_to_fit) {
  Adjacency_Graph<false> graph;
  EXPECT_EQ(graph.capacity().first, 0);
  EXPECT_EQ(graph.capacity().second, 0);

  graph.reserve(5);
  EXPECT_EQ(graph.capacity().first, 5);
  EXPECT_EQ(graph.capacity().second, 0);

  graph.shrink_to_fit();
  EXPECT_EQ(graph.capacity().first, 0);
  EXPECT_EQ(graph.capacity().second, 0);
}